

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fairness_test.cpp
# Opt level: O2

void __thiscall
FairMutexTest_FifoSched_Test<yamc::fair::timed_mutex>::TestBody
          (FairMutexTest_FifoSched_Test<yamc::fair::timed_mutex> *this)

{
  anon_class_24_3_d9b03587_for_f f;
  char *message;
  duration<long,_std::ratio<1L,_1000L>_> local_158;
  duration<long,_std::ratio<1L,_1000L>_> local_150;
  AssertionResult gtest_ar;
  stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  sw;
  atomic<int> step;
  TypeParam mtx;
  phaser phaser;
  
  step.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  yamc::test::phaser::phaser(&phaser,3);
  yamc::fair::detail::timed_mutex_impl::timed_mutex_impl((timed_mutex_impl *)&mtx);
  sw.start_.__d.__r = (time_point)std::chrono::_V2::system_clock::now();
  f.mtx = &mtx;
  f.phaser = &phaser;
  f.step = &step;
  yamc::test::
  task_runner<FairMutexTest_FifoSched_Test<yamc::fair::timed_mutex>::TestBody()::_lambda(unsigned_long)_1_>
            (3,f);
  local_158.__r = (rep)&DAT_00000578;
  local_150 = yamc::test::
              stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
              ::elapsed(&sw);
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)&gtest_ar,"std::chrono::milliseconds(200) * 7","sw.elapsed()",&local_158,
             &local_150);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_158);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/fairness_test.cpp"
               ,0x57,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
    if ((long *)local_158.__r != (long *)0x0) {
      (**(code **)(*(long *)local_158.__r + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::condition_variable::~condition_variable((condition_variable *)&mtx.field_0x20);
  yamc::test::phaser::~phaser(&phaser);
  return;
}

Assistant:

TYPED_TEST(FairMutexTest, FifoSched)
{
  SETUP_STEPTEST;
  yamc::test::phaser phaser(3);
  TypeParam mtx;
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(3, [&](std::size_t id) {
    auto ph = phaser.get(id);
    switch (id) {
    case 0:
      EXPECT_TRUE(mtx.try_lock());
      EXPECT_STEP(1);
      ph.advance(2);  // p1-2
      ph.await();     // p3
      EXPECT_STEP(4);
      mtx.unlock();
      mtx.lock();
      EXPECT_STEP(7);
      mtx.unlock();
      break;
    case 1:
      ph.await();     // p1
      EXPECT_STEP(2);
      ph.advance(2);  // p2-3
      mtx.lock();
      EXPECT_STEP(5);
      mtx.unlock();
      break;
    case 2:
      ph.await();     // p1
      EXPECT_FALSE(mtx.try_lock());
      ph.await();     // p2
      EXPECT_STEP(3);
      ph.advance(1);  // p3
      mtx.lock();
      EXPECT_STEP(6);
      mtx.unlock();
      break;
    }
  });
  EXPECT_LE(TEST_TICKS * 7, sw.elapsed());
}